

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMGBndry.cpp
# Opt level: O2

void amrex::MLMGBndry::setBoxBC
               (RealTuple *bloc,BCTuple *bctag,Box *bx,Box *domain,Array<LinOpBCType,_3> *lo,
               Array<LinOpBCType,_3> *hi,Real *dx,int ratio,RealVect *interior_bloc,
               Array<Real,_3> *domain_bloc_lo,Array<Real,_3> *domain_bloc_hi,
               GpuArray<int,_3U> *is_periodic)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  Array<Real,_3> *pAVar5;
  ulong uVar6;
  ulong uVar7;
  Array<LinOpBCType,_3> *pAVar8;
  long lVar9;
  double dVar10;
  
  uVar7 = 0;
  for (lVar9 = 0; uVar6 = uVar7 / 3, lVar9 != 0x18; lVar9 = lVar9 + 4) {
    lVar1 = (long)domain + uVar6 * -0xc;
    lVar2 = (long)bx + uVar6 * -0xc;
    lVar4 = lVar1 + 0xc;
    if (uVar7 < 3) {
      lVar4 = lVar1;
    }
    lVar1 = lVar2 + 0xc;
    if (uVar7 < 3) {
      lVar1 = lVar2;
    }
    if ((*(int *)(lVar4 + lVar9) == *(int *)(lVar1 + lVar9)) &&
       (*(int *)((long)is_periodic[-uVar6].arr + lVar9) == 0)) {
      pAVar8 = hi;
      pAVar5 = domain_bloc_hi;
      if (uVar7 < 3) {
        pAVar8 = lo;
        pAVar5 = domain_bloc_lo;
      }
      *(undefined8 *)((long)bloc->_M_elems + lVar9 * 2) =
           *(undefined8 *)((long)pAVar5[-uVar6]._M_elems + lVar9 * 2);
      iVar3 = *(int *)((long)pAVar8[-uVar6]._M_elems + lVar9);
      if (iVar3 == 0x67) {
        *(undefined4 *)((long)&bctag->_M_elems[0].bctype + lVar9) = 0x67;
      }
      else if (iVar3 == 0x66) {
        *(undefined4 *)((long)&bctag->_M_elems[0].bctype + lVar9) = 0x66;
      }
      else if (iVar3 == 0x65) {
        *(undefined4 *)((long)&bctag->_M_elems[0].bctype + lVar9) = 0x65;
      }
      else {
        Abort_host("MLMGBndry::setBoxBC: Unknown LinOpBCType");
      }
    }
    else {
      *(undefined4 *)((long)&bctag->_M_elems[0].bctype + lVar9) = 0x65;
      if (ratio < 1) {
        dVar10 = *(double *)((long)interior_bloc[-uVar6].vect + lVar9 * 2);
      }
      else {
        dVar10 = *(double *)((long)dx + lVar9 * 2 + uVar6 * -0x18) * (double)ratio * 0.5;
      }
      *(double *)((long)bloc->_M_elems + lVar9 * 2) = dVar10;
    }
    uVar7 = uVar7 + 1;
  }
  return;
}

Assistant:

void
MLMGBndry::setBoxBC (RealTuple& bloc, BCTuple& bctag, const Box& bx, const Box& domain,
                     const Array<LinOpBCType,AMREX_SPACEDIM>& lo,
                     const Array<LinOpBCType,AMREX_SPACEDIM>& hi,
                     const Real* dx, int ratio,
                     const RealVect& interior_bloc,
                     const Array<Real,AMREX_SPACEDIM>& domain_bloc_lo,
                     const Array<Real,AMREX_SPACEDIM>& domain_bloc_hi,
                     const GpuArray<int,AMREX_SPACEDIM>& is_periodic)
{
    for (OrientationIter fi; fi; ++fi)
    {
        const Orientation face = fi();
        const int         dir  = face.coordDir();

        if (domain[face] == bx[face] && !is_periodic[dir])
        {
            // All physical bc values are located on face.
            bloc[face] = face.isLow() ? domain_bloc_lo[dir] : domain_bloc_hi[dir];
            const auto linop_bc  = face.isLow() ? lo[dir] : hi[dir];
            if (linop_bc == LinOpBCType::Dirichlet) {
                bctag[face] = AMREX_LO_DIRICHLET;
            } else if (linop_bc == LinOpBCType::Neumann) {
                bctag[face] = AMREX_LO_NEUMANN;
            } else if (linop_bc == LinOpBCType::reflect_odd) {
                bctag[face] = AMREX_LO_REFLECT_ODD;
            } else {
                amrex::Abort("MLMGBndry::setBoxBC: Unknown LinOpBCType");
            }
        }
        else
        {
            // Internal bndry.
            bctag[face] = AMREX_LO_DIRICHLET;
            bloc[face]  = ratio > 0 ? Real(0.5)*ratio*dx[dir] : interior_bloc[dir];
            // If this is next to another same level box, bloc is
            // wrong.  But it doesn't matter, because we also have
            // mask.  It is used only if mask says it is next to
            // coarse cells.
        }
    }
}